

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

void anon_unknown.dwarf_e46b9e::MakeTreeRelative(aiNode *start,aiMatrix4x4 *combined)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  aiMatrix4x4t<float> *paVar33;
  ulong uVar34;
  aiMatrix4x4 old;
  aiMatrix4x4 local_98;
  aiMatrix4x4t<float> local_58;
  
  local_98.a1 = (start->mTransformation).a1;
  local_98.a2 = (start->mTransformation).a2;
  local_98.a3 = (start->mTransformation).a3;
  local_98.a4 = (start->mTransformation).a4;
  local_98.b1 = (start->mTransformation).b1;
  local_98.b2 = (start->mTransformation).b2;
  local_98.b3 = (start->mTransformation).b3;
  local_98.b4 = (start->mTransformation).b4;
  local_98.c1 = (start->mTransformation).c1;
  local_98.c2 = (start->mTransformation).c2;
  local_98.c3 = (start->mTransformation).c3;
  local_98.c4 = (start->mTransformation).c4;
  local_98.d1 = (start->mTransformation).d1;
  local_98.d2 = (start->mTransformation).d2;
  local_98.d3 = (start->mTransformation).d3;
  local_98.d4 = (start->mTransformation).d4;
  if (((((((0.01 < ABS(combined->a2)) || (0.01 < ABS(combined->a3))) || (0.01 < ABS(combined->a4)))
        || ((0.01 < ABS(combined->b1) || (0.01 < ABS(combined->b3))))) ||
       (((0.01 < ABS(combined->b4) || ((0.01 < ABS(combined->c1) || (0.01 < ABS(combined->c2))))) ||
        (0.01 < ABS(combined->c4))))) ||
      ((((0.01 < ABS(combined->d1) || (0.01 < ABS(combined->d2))) || (0.01 < ABS(combined->d3))) ||
       (((1.01 < combined->a1 || (combined->a1 < 0.99)) ||
        ((1.01 < combined->b2 || ((combined->b2 < 0.99 || (1.01 < combined->c3)))))))))) ||
     ((combined->c3 < 0.99 || ((1.01 < combined->d4 || (combined->d4 < 0.99)))))) {
    local_58.a1 = combined->a1;
    local_58.a2 = combined->a2;
    local_58.a3 = combined->a3;
    local_58.a4 = combined->a4;
    local_58.b1 = combined->b1;
    local_58.b2 = combined->b2;
    local_58.b3 = combined->b3;
    local_58.b4 = combined->b4;
    local_58.c1 = combined->c1;
    local_58.c2 = combined->c2;
    local_58.c3 = combined->c3;
    local_58.c4 = combined->c4;
    local_58.d1 = combined->d1;
    local_58.d2 = combined->d2;
    local_58.d3 = combined->d3;
    local_58.d4 = combined->d4;
    paVar33 = aiMatrix4x4t<float>::Inverse(&local_58);
    fVar1 = paVar33->a1;
    fVar2 = paVar33->a2;
    fVar3 = paVar33->a3;
    fVar4 = paVar33->a4;
    fVar5 = (start->mTransformation).b1;
    fVar6 = (start->mTransformation).a1;
    fVar7 = (start->mTransformation).a2;
    fVar8 = (start->mTransformation).c1;
    fVar9 = (start->mTransformation).d1;
    fVar10 = (start->mTransformation).b2;
    fVar11 = (start->mTransformation).c2;
    fVar12 = (start->mTransformation).d2;
    fVar13 = (start->mTransformation).b3;
    fVar14 = (start->mTransformation).a3;
    fVar15 = (start->mTransformation).c3;
    fVar16 = (start->mTransformation).d3;
    fVar17 = (start->mTransformation).b4;
    fVar18 = (start->mTransformation).a4;
    fVar19 = (start->mTransformation).c4;
    fVar20 = (start->mTransformation).d4;
    fVar21 = paVar33->b2;
    fVar22 = paVar33->b1;
    fVar23 = paVar33->b3;
    fVar24 = paVar33->b4;
    fVar25 = paVar33->c2;
    fVar26 = paVar33->c1;
    fVar27 = paVar33->c3;
    fVar28 = paVar33->c4;
    fVar29 = paVar33->d2;
    fVar30 = paVar33->d1;
    fVar31 = paVar33->d3;
    fVar32 = paVar33->d4;
    (start->mTransformation).a1 = fVar9 * fVar4 + fVar8 * fVar3 + fVar6 * fVar1 + fVar2 * fVar5;
    (start->mTransformation).a2 = fVar12 * fVar4 + fVar11 * fVar3 + fVar7 * fVar1 + fVar2 * fVar10;
    (start->mTransformation).a3 = fVar16 * fVar4 + fVar15 * fVar3 + fVar14 * fVar1 + fVar2 * fVar13;
    (start->mTransformation).a4 = fVar4 * fVar20 + fVar3 * fVar19 + fVar1 * fVar18 + fVar2 * fVar17;
    (start->mTransformation).b1 = fVar9 * fVar24 + fVar8 * fVar23 + fVar6 * fVar22 + fVar21 * fVar5;
    (start->mTransformation).b2 =
         fVar12 * fVar24 + fVar11 * fVar23 + fVar7 * fVar22 + fVar21 * fVar10;
    (start->mTransformation).b3 =
         fVar16 * fVar24 + fVar15 * fVar23 + fVar14 * fVar22 + fVar21 * fVar13;
    (start->mTransformation).b4 =
         fVar24 * fVar20 + fVar23 * fVar19 + fVar22 * fVar18 + fVar21 * fVar17;
    (start->mTransformation).c1 = fVar9 * fVar28 + fVar8 * fVar27 + fVar6 * fVar26 + fVar25 * fVar5;
    (start->mTransformation).c2 =
         fVar12 * fVar28 + fVar11 * fVar27 + fVar7 * fVar26 + fVar25 * fVar10;
    (start->mTransformation).c3 =
         fVar16 * fVar28 + fVar15 * fVar27 + fVar14 * fVar26 + fVar25 * fVar13;
    (start->mTransformation).c4 =
         fVar28 * fVar20 + fVar27 * fVar19 + fVar26 * fVar18 + fVar25 * fVar17;
    (start->mTransformation).d1 = fVar9 * fVar32 + fVar8 * fVar31 + fVar6 * fVar30 + fVar5 * fVar29;
    (start->mTransformation).d2 =
         fVar12 * fVar32 + fVar11 * fVar31 + fVar7 * fVar30 + fVar10 * fVar29;
    (start->mTransformation).d3 =
         fVar16 * fVar32 + fVar15 * fVar31 + fVar14 * fVar30 + fVar13 * fVar29;
    (start->mTransformation).d4 =
         fVar20 * fVar32 + fVar19 * fVar31 + fVar18 * fVar30 + fVar29 * fVar17;
  }
  if (start->mNumChildren != 0) {
    uVar34 = 0;
    do {
      MakeTreeRelative(start->mChildren[uVar34],&local_98);
      uVar34 = uVar34 + 1;
    } while (uVar34 < start->mNumChildren);
  }
  return;
}

Assistant:

void MakeTreeRelative(aiNode* start, const aiMatrix4x4& combined)
{
    // combined is the parent's absolute transformation matrix
    const aiMatrix4x4 old = start->mTransformation;

    if (!combined.IsIdentity()) {
        start->mTransformation = aiMatrix4x4(combined).Inverse() * start->mTransformation;
    }

    // All nodes store absolute transformations right now, so we need to make them relative
    for (unsigned int i = 0; i < start->mNumChildren; ++i) {
        MakeTreeRelative(start->mChildren[i],old);
    }
}